

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O2

void cdef_find_dir_dual_avx2
               (uint16_t *img1,uint16_t *img2,int stride,int32_t *var_out_1st,int32_t *var_out_2nd,
               int coeff_shift,int *out_dir_1st_8x8,int *out_dir_2nd_8x8)

{
  uint uVar1;
  ushort uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  __m256i alVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int32_t cost_first_8x8 [8];
  __m256i lines [8];
  int32_t aiStack_1c0 [4];
  int32_t local_1b0 [4];
  int32_t local_1a0 [4];
  int32_t local_190 [4];
  undefined1 local_180 [32];
  __m256i local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_180 = ZEXT432((uint)coeff_shift);
  lVar11 = 0;
  auVar16._8_2_ = 0xff80;
  auVar16._0_8_ = 0xff80ff80ff80ff80;
  auVar16._10_2_ = 0xff80;
  auVar16._12_2_ = 0xff80;
  auVar16._14_2_ = 0xff80;
  auVar16._16_2_ = 0xff80;
  auVar16._18_2_ = 0xff80;
  auVar16._20_2_ = 0xff80;
  auVar16._22_2_ = 0xff80;
  auVar16._24_2_ = 0xff80;
  auVar16._26_2_ = 0xff80;
  auVar16._28_2_ = 0xff80;
  auVar16._30_2_ = 0xff80;
  for (lVar12 = 0; lVar12 != 0x100; lVar12 = lVar12 + 0x20) {
    auVar17._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])((long)img2 + lVar11) +
         ZEXT116(1) * *(undefined1 (*) [16])((long)img1 + lVar11);
    auVar17._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])((long)img2 + lVar11);
    auVar17 = vpsraw_avx2(auVar17,ZEXT416((uint)coeff_shift));
    auVar17 = vpaddw_avx2(auVar17,auVar16);
    *(undefined1 (*) [32])((long)local_160 + lVar12) = auVar17;
    lVar11 = lVar11 + (long)stride * 2;
  }
  compute_directions_avx2(&local_160,local_190,local_1b0);
  auVar5 = vpunpcklwd_avx2((undefined1  [32])local_160,local_140);
  auVar6 = vpunpcklwd_avx2(local_120,local_100);
  auVar16 = vpunpckhwd_avx2((undefined1  [32])local_160,local_140);
  auVar17 = vpunpckhwd_avx2(local_120,local_100);
  auVar7 = vpunpcklwd_avx2(local_e0,local_c0);
  auVar8 = vpunpcklwd_avx2(local_a0,local_80);
  auVar3 = vpunpckhwd_avx2(local_e0,local_c0);
  auVar4 = vpunpckhwd_avx2(local_a0,local_80);
  auVar9 = vpunpckldq_avx2(auVar5,auVar6);
  auVar10 = vpunpckldq_avx2(auVar7,auVar8);
  auVar5 = vpunpckhdq_avx2(auVar5,auVar6);
  auVar6 = vpunpckhdq_avx2(auVar7,auVar8);
  auVar7 = vpunpckldq_avx2(auVar16,auVar17);
  auVar8 = vpunpckldq_avx2(auVar3,auVar4);
  auVar16 = vpunpckhdq_avx2(auVar16,auVar17);
  auVar17 = vpunpckhdq_avx2(auVar3,auVar4);
  local_80 = vpunpcklqdq_avx2(auVar9,auVar10);
  local_a0 = vpunpckhqdq_avx2(auVar9,auVar10);
  local_c0 = vpunpcklqdq_avx2(auVar5,auVar6);
  local_e0 = vpunpckhqdq_avx2(auVar5,auVar6);
  local_100 = vpunpcklqdq_avx2(auVar7,auVar8);
  local_120 = vpunpckhqdq_avx2(auVar7,auVar8);
  local_140 = vpunpcklqdq_avx2(auVar16,auVar17);
  alVar15 = (__m256i)vpunpckhqdq_avx2(auVar16,auVar17);
  local_160 = alVar15;
  compute_directions_avx2(&local_160,local_1a0,aiStack_1c0);
  auVar16 = vpmaxsd_avx2((undefined1  [32])alVar15,local_180);
  auVar17 = vpshufd_avx2(auVar16,0x4e);
  auVar16 = vpmaxsd_avx2(auVar16,auVar17);
  auVar17 = vpshufd_avx2(auVar16,0x39);
  auVar3 = vpmaxsd_avx2(auVar16,auVar17);
  auVar16 = vpcmpeqd_avx2(auVar3,local_180);
  auVar17 = vpcmpeqd_avx2(auVar3,(undefined1  [32])alVar15);
  auVar18 = vpslld_avx(auVar16._16_16_,0x1f);
  auVar18 = vpsrad_avx(auVar18,0x1f);
  auVar19 = vpslld_avx(auVar17._16_16_,0x1f);
  auVar19 = vpsrad_avx(auVar19,0x1f);
  auVar19 = vpackssdw_avx(auVar19,auVar18);
  auVar18 = vpackssdw_avx(auVar17._0_16_,auVar16._0_16_);
  auVar18 = vpacksswb_avx(auVar18,auVar18);
  uVar2 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar18[0xf] >> 7) << 0xf;
  uVar13 = uVar2 - 1 ^ (uint)uVar2;
  uVar1 = 0x1f;
  if (uVar13 != 0) {
    for (; uVar13 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  auVar18 = vpacksswb_avx(auVar19,auVar19);
  uVar2 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar18[0xf] >> 7) << 0xf;
  uVar14 = uVar2 - 1 ^ (uint)uVar2;
  uVar13 = 0x1f;
  if (uVar14 != 0) {
    for (; uVar14 >> uVar13 == 0; uVar13 = uVar13 - 1) {
    }
  }
  *var_out_1st = auVar3._0_4_ - local_1a0[uVar1 & 7 ^ 4];
  *var_out_2nd = auVar3._16_4_ - aiStack_1c0[uVar13 & 7 ^ 4];
  *var_out_1st = *var_out_1st >> 10;
  *var_out_2nd = *var_out_2nd >> 10;
  *out_dir_1st_8x8 = uVar1;
  *out_dir_2nd_8x8 = uVar13;
  return;
}

Assistant:

void cdef_find_dir_dual_avx2(const uint16_t *img1, const uint16_t *img2,
                             int stride, int32_t *var_out_1st,
                             int32_t *var_out_2nd, int coeff_shift,
                             int *out_dir_1st_8x8, int *out_dir_2nd_8x8) {
  int32_t cost_first_8x8[8];
  int32_t cost_second_8x8[8];
  // Used to store the best cost for 2 8x8's.
  int32_t best_cost[2] = { 0 };
  // Best direction for 2 8x8's.
  int best_dir[2] = { 0 };

  const __m128i const_coeff_shift_reg = _mm_cvtsi32_si128(coeff_shift);
  const __m256i const_128_reg = _mm256_set1_epi16(128);
  __m256i lines[8];
  for (int i = 0; i < 8; i++) {
    const __m128i src_1 = _mm_loadu_si128((const __m128i *)&img1[i * stride]);
    const __m128i src_2 = _mm_loadu_si128((const __m128i *)&img2[i * stride]);

    lines[i] = _mm256_insertf128_si256(_mm256_castsi128_si256(src_1), src_2, 1);
    lines[i] = _mm256_sub_epi16(
        _mm256_sra_epi16(lines[i], const_coeff_shift_reg), const_128_reg);
  }

  /* Compute "mostly vertical" directions. */
  const __m256i dir47 =
      compute_directions_avx2(lines, cost_first_8x8 + 4, cost_second_8x8 + 4);

  /* Transpose and reverse the order of the lines. */
  array_reverse_transpose_8x8_avx2(lines, lines);

  /* Compute "mostly horizontal" directions. */
  const __m256i dir03 =
      compute_directions_avx2(lines, cost_first_8x8, cost_second_8x8);

  __m256i max = _mm256_max_epi32(dir03, dir47);
  max =
      _mm256_max_epi32(max, _mm256_or_si256(_mm256_srli_si256(max, 8),
                                            _mm256_slli_si256(max, 16 - (8))));
  max =
      _mm256_max_epi32(max, _mm256_or_si256(_mm256_srli_si256(max, 4),
                                            _mm256_slli_si256(max, 16 - (4))));

  const __m128i first_8x8_output = _mm256_castsi256_si128(max);
  const __m128i second_8x8_output = _mm256_extractf128_si256(max, 1);
  const __m128i cmpeg_res_00 =
      _mm_cmpeq_epi32(first_8x8_output, _mm256_castsi256_si128(dir47));
  const __m128i cmpeg_res_01 =
      _mm_cmpeq_epi32(first_8x8_output, _mm256_castsi256_si128(dir03));
  const __m128i cmpeg_res_10 =
      _mm_cmpeq_epi32(second_8x8_output, _mm256_extractf128_si256(dir47, 1));
  const __m128i cmpeg_res_11 =
      _mm_cmpeq_epi32(second_8x8_output, _mm256_extractf128_si256(dir03, 1));
  const __m128i t_first_8x8 = _mm_packs_epi32(cmpeg_res_01, cmpeg_res_00);
  const __m128i t_second_8x8 = _mm_packs_epi32(cmpeg_res_11, cmpeg_res_10);

  best_cost[0] = _mm_cvtsi128_si32(_mm256_castsi256_si128(max));
  best_cost[1] = _mm_cvtsi128_si32(second_8x8_output);
  best_dir[0] = _mm_movemask_epi8(_mm_packs_epi16(t_first_8x8, t_first_8x8));
  best_dir[0] =
      get_msb(best_dir[0] ^ (best_dir[0] - 1));  // Count trailing zeros
  best_dir[1] = _mm_movemask_epi8(_mm_packs_epi16(t_second_8x8, t_second_8x8));
  best_dir[1] =
      get_msb(best_dir[1] ^ (best_dir[1] - 1));  // Count trailing zeros

  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var_out_1st = best_cost[0] - cost_first_8x8[(best_dir[0] + 4) & 7];
  *var_out_2nd = best_cost[1] - cost_second_8x8[(best_dir[1] + 4) & 7];

  /* We'd normally divide by 840, but dividing by 1024 is close enough
  for what we're going to do with this. */
  *var_out_1st >>= 10;
  *var_out_2nd >>= 10;
  *out_dir_1st_8x8 = best_dir[0];
  *out_dir_2nd_8x8 = best_dir[1];
}